

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

EffectiveSign __thiscall
slang::ast::UnaryExpression::getEffectiveSignImpl(UnaryExpression *this,bool isForConversion)

{
  bool bVar1;
  EffectiveSign EVar2;
  
  EVar2 = this->op;
  if (EVar2 != Either) {
    if (EVar2 != Signed) {
      if (EVar2 == Unsigned) goto LAB_004274fd;
      bVar1 = Type::isSigned((this->super_Expression).type.ptr);
      EVar2 = (EffectiveSign)bVar1;
    }
    return EVar2;
  }
LAB_004274fd:
  EVar2 = Expression::getEffectiveSign(this->operand_,isForConversion);
  return EVar2;
}

Assistant:

Expression::EffectiveSign UnaryExpression::getEffectiveSignImpl(bool isForConversion) const {
    switch (op) {
        case UnaryOperator::Plus:
        case UnaryOperator::BitwiseNot:
            return operand().getEffectiveSign(isForConversion);
        case UnaryOperator::Minus:
            // If we're negating a number it should be signed.
            return EffectiveSign::Signed;
        default:
            return type->isSigned() ? EffectiveSign::Signed : EffectiveSign::Unsigned;
    }
}